

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O3

void __thiscall xercesc_4_0::AbstractDOMParser::docComment(AbstractDOMParser *this,XMLCh *comment)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  long lVar3;
  undefined8 *puVar4;
  DOMException *this_00;
  
  if (this->fCreateCommentNodes != true) {
    return;
  }
  iVar1 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x34])();
  if (((this->fCurrentParent != (DOMNode *)0x0) &&
      (plVar2 = (long *)__dynamic_cast(this->fCurrentParent,&DOMNode::typeinfo,
                                       &HasDOMParentImpl::typeinfo,0xfffffffffffffffe),
      plVar2 != (long *)0x0)) && (lVar3 = (**(code **)(*plVar2 + 0x10))(plVar2), lVar3 != 0)) {
    puVar4 = (undefined8 *)(**(code **)(*plVar2 + 0x10))(plVar2);
    (**(code **)*puVar4)(puVar4,(DOMNode *)CONCAT44(extraout_var,iVar1));
    this->fCurrentNode = (DOMNode *)CONCAT44(extraout_var,iVar1);
    return;
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void AbstractDOMParser::docComment(const XMLCh* const comment)
{
    if (fCreateCommentNodes) {
        DOMComment *dcom = fDocument->createComment(comment);
        castToParentImpl (fCurrentParent)->appendChildFast (dcom);
        fCurrentNode = dcom;
    }
}